

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

uint32_t tohandle(skynet_context *context,char *param)

{
  ulong uVar1;
  uint32_t local_1c;
  uint32_t handle;
  char *param_local;
  skynet_context *context_local;
  
  local_1c = 0;
  if (*param == ':') {
    uVar1 = strtoul(param + 1,(char **)0x0,0x10);
    local_1c = (uint32_t)uVar1;
  }
  else if (*param == '.') {
    local_1c = skynet_handle_findname(param + 1);
  }
  else {
    skynet_error(context,"Can\'t convert %s to handle",param);
  }
  return local_1c;
}

Assistant:

static uint32_t
tohandle(struct skynet_context * context, const char * param) {
	uint32_t handle = 0;
	if (param[0] == ':') {
		handle = strtoul(param+1, NULL, 16);
	} else if (param[0] == '.') {
		handle = skynet_handle_findname(param+1);
	} else {
		skynet_error(context, "Can't convert %s to handle",param);
	}

	return handle;
}